

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O2

void __thiscall Circuit::recompute_map(Circuit *this)

{
  GateType GVar1;
  pointer pGVar2;
  pointer pGVar3;
  pointer puVar4;
  pointer puVar5;
  pointer *ppuVar6;
  uint i;
  ulong uVar7;
  uint i_1;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  
  pGVar2 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar3 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this->num_AND = 0;
  this->total_num_AND = 0;
  uVar12 = (long)pGVar3 - (long)pGVar2 >> 2;
  uVar11 = uVar12 & 0xffffffff;
  ppuVar6 = (pointer *)
            ((long)&(((this->GateO).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  uVar7 = 0;
  uVar9 = 0;
  uVar8 = 0;
  do {
    if (uVar11 == uVar7) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->map,(ulong)uVar9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->imap,uVar12 & 0xffffffff);
      puVar4 = (this->imap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
        puVar4[uVar7] = (int)uVar12 * 2;
      }
      pGVar2 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (this->map).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (this->imap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
        if (pGVar2[uVar7] == AND) {
          puVar4[uVar8] = (uint)uVar7;
          puVar5[uVar7] = uVar8;
          uVar8 = uVar8 + 1;
        }
      }
      return;
    }
    GVar1 = pGVar2[uVar7];
    if (GVar1 == MAND) {
      iVar10 = (int)((ulong)((long)*ppuVar6 - (long)((_Vector_impl_data *)(ppuVar6 + -1))->_M_start)
                    >> 2);
LAB_00103c59:
      uVar8 = uVar8 + iVar10;
      this->total_num_AND = uVar8;
    }
    else if (GVar1 == AND) {
      uVar9 = uVar9 + 1;
      this->num_AND = uVar9;
      iVar10 = 1;
      goto LAB_00103c59;
    }
    uVar7 = uVar7 + 1;
    ppuVar6 = ppuVar6 + 3;
  } while( true );
}

Assistant:

void Circuit::recompute_map() {
  unsigned int nG = GateT.size();

  num_AND = 0;
  total_num_AND = 0;
  for (unsigned int i = 0; i < nG; i++) {
    if (GateT[i] == AND) {
      num_AND++;
      total_num_AND++;
    }
    if (GateT[i] == MAND) {
      total_num_AND += GateO[i].size();
    }
  }

  // Define map between AND gates and the actual gates
  map.resize(num_AND);
  imap.resize(nG);

  // Set stupid default value for imap, to be caught in access function
  for (unsigned int i = 0; i < nG; i++) {
    imap[i] = 2 * nG;
  }
  unsigned int cnt = 0;
  for (unsigned int i = 0; i < nG; i++) {
    if (GateT[i] == AND) {
      map[cnt] = i;
      imap[i] = cnt;
      cnt++;
    }
  }
}